

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

mmdb_uint128_t * get_uint128(mmdb_uint128_t *__return_storage_ptr__,uint8_t *p,int length)

{
  undefined8 local_38;
  mmdb_uint128_t value;
  mmdb_uint128_t *pmStack_20;
  int length_local;
  uint8_t *p_local;
  
  local_38 = (mmdb_uint128_t *)0x0;
  value._12_4_ = (int)p;
  pmStack_20 = __return_storage_ptr__;
  while (0 < value._12_4_) {
    local_38 = (mmdb_uint128_t *)((long)local_38 * 0x100 + (ulong)(byte)*pmStack_20);
    value._12_4_ = value._12_4_ + -1;
    pmStack_20 = (mmdb_uint128_t *)((long)pmStack_20 + 1);
  }
  return local_38;
}

Assistant:

static mmdb_uint128_t get_uint128(const uint8_t *p, int length) {
    mmdb_uint128_t value = 0;
    while (length-- > 0) {
        value <<= 8;
        value += *p++;
    }
    return value;
}